

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O0

void ImGuizmo::ComputeSnap(float *value,float snap)

{
  float fVar1;
  float moduloRatio;
  float modulo;
  float snap_local;
  float *value_local;
  
  if (1.1920929e-07 < snap) {
    fVar1 = fmodf(*value,snap);
    if (0.5 <= ABS(fVar1) / snap) {
      if (0.5 < ABS(fVar1) / snap) {
        *value = snap * (float)(~-(uint)(*value < 0.0) & 0x3f800000 |
                               -(uint)(*value < 0.0) & 0xbf800000) + (*value - fVar1);
      }
    }
    else {
      *value = *value - fVar1;
    }
  }
  return;
}

Assistant:

static void ComputeSnap(float*value, float snap)
   {
      if (snap <= FLT_EPSILON)
         return;
      float modulo = fmodf(*value, snap);
      float moduloRatio = fabsf(modulo) / snap;
      if (moduloRatio < snapTension)
         *value -= modulo;
      else if (moduloRatio >(1.f - snapTension))
         *value = *value - modulo + snap * ((*value<0.f) ? -1.f : 1.f);
   }